

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::TAPReporter::testRunEnded(TAPReporter *this,TestRunStats *_testRunStats)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,"1..");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  if ((_testRunStats->totals).testCases.failed + (_testRunStats->totals).testCases.passed +
      (_testRunStats->totals).testCases.failedButOk + (_testRunStats->totals).testCases.skipped == 0
     ) {
    std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,
                    " # Skipped: No tests ran.");
  }
  std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,"\n\n");
  std::ostream::flush();
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  return;
}

Assistant:

void TAPReporter::testRunEnded(TestRunStats const& _testRunStats) {
        m_stream << "1.." << _testRunStats.totals.assertions.total();
        if (_testRunStats.totals.testCases.total() == 0) {
            m_stream << " # Skipped: No tests ran.";
        }
        m_stream << "\n\n" << std::flush;
        StreamingReporterBase::testRunEnded(_testRunStats);
    }